

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParseEndTag1(xmlParserCtxtPtr ctxt,int line)

{
  endElementSAXFunc p_Var1;
  xmlParserInputPtr pxVar2;
  xmlChar *pxVar3;
  xmlChar *pxVar4;
  
  pxVar2 = ctxt->input;
  if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
    xmlParserGrow(ctxt);
    pxVar2 = ctxt->input;
  }
  pxVar3 = pxVar2->cur;
  if ((*pxVar3 == '<') && (pxVar3[1] == '/')) {
    pxVar2->cur = pxVar3 + 2;
    pxVar2->col = pxVar2->col + 2;
    if (pxVar3[2] == '\0') {
      xmlParserGrow(ctxt);
    }
    pxVar3 = xmlParseNameAndCompare(ctxt,ctxt->name);
    pxVar2 = ctxt->input;
    if (((pxVar2->flags & 0x40) == 0) && ((long)pxVar2->end - (long)pxVar2->cur < 0xfa)) {
      xmlParserGrow(ctxt);
    }
    xmlSkipBlankChars(ctxt);
    pxVar2 = ctxt->input;
    pxVar4 = pxVar2->cur;
    if (*pxVar4 == '>') {
      pxVar2->col = pxVar2->col + 1;
      pxVar2->cur = pxVar4 + 1;
      if (pxVar4[1] == '\0') {
        xmlParserGrow(ctxt);
      }
    }
    else {
      xmlFatalErr(ctxt,XML_ERR_GT_REQUIRED,(char *)0x0);
    }
    if (pxVar3 != (xmlChar *)0x1) {
      pxVar4 = (xmlChar *)"unparsable";
      if (pxVar3 != (xmlChar *)0x0) {
        pxVar4 = pxVar3;
      }
      xmlFatalErrMsgStrIntStr
                (ctxt,XML_ERR_TAG_NAME_MISMATCH,
                 "Opening and ending tag mismatch: %s line %d and %s\n",ctxt->name,0,pxVar4);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) &&
        (p_Var1 = ctxt->sax->endElement, p_Var1 != (endElementSAXFunc)0x0)) &&
       (ctxt->disableSAX == 0)) {
      (*p_Var1)(ctxt->userData,ctxt->name);
    }
    namePop(ctxt);
    spacePop(ctxt);
    return;
  }
  xmlFatalErrMsg(ctxt,XML_ERR_LTSLASH_REQUIRED,"xmlParseEndTag: \'</\' not found\n");
  return;
}

Assistant:

static void
xmlParseEndTag1(xmlParserCtxtPtr ctxt, int line) {
    const xmlChar *name;

    GROW;
    if ((RAW != '<') || (NXT(1) != '/')) {
	xmlFatalErrMsg(ctxt, XML_ERR_LTSLASH_REQUIRED,
		       "xmlParseEndTag: '</' not found\n");
	return;
    }
    SKIP(2);

    name = xmlParseNameAndCompare(ctxt,ctxt->name);

    /*
     * We should definitely be at the ending "S? '>'" part
     */
    GROW;
    SKIP_BLANKS;
    if ((!IS_BYTE_CHAR(RAW)) || (RAW != '>')) {
	xmlFatalErr(ctxt, XML_ERR_GT_REQUIRED, NULL);
    } else
	NEXT1;

    /*
     * [ WFC: Element Type Match ]
     * The Name in an element's end-tag must match the element type in the
     * start-tag.
     *
     */
    if (name != (xmlChar*)1) {
        if (name == NULL) name = BAD_CAST "unparsable";
        xmlFatalErrMsgStrIntStr(ctxt, XML_ERR_TAG_NAME_MISMATCH,
		     "Opening and ending tag mismatch: %s line %d and %s\n",
		                ctxt->name, line, name);
    }

    /*
     * SAX: End of Tag
     */
    if ((ctxt->sax != NULL) && (ctxt->sax->endElement != NULL) &&
	(!ctxt->disableSAX))
        ctxt->sax->endElement(ctxt->userData, ctxt->name);

    namePop(ctxt);
    spacePop(ctxt);
}